

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzDoubleMod_fast(word *b,word *a,word *mod,size_t n)

{
  word wVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = 0;
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    wVar1 = uVar4 + a[sVar3] * 2;
    uVar4 = a[sVar3] >> 0x3f;
    b[sVar3] = wVar1;
  }
  if (uVar4 == 0) {
    iVar2 = wwCmp(b,mod,n);
    if (iVar2 < 0) {
      return;
    }
  }
  zzSub2(b,mod,n);
  return;
}

Assistant:

void FAST(zzDoubleMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word hi;
	size_t i;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	// b <- a * 2
	for (i = 0; i < n; ++i)
		hi = a[i] >> (B_PER_W - 1),
		b[i] = a[i] << 1 | carry,
		carry = hi;
	// sub mod
	if (carry || wwCmp(b, mod, n) >= 0)
		zzSub2(b, mod, n);
	// очистка
	hi = carry = 0;
}